

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexToNFA.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
NFA::getClosure(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NFA *this,int indx)

{
  _Map_pointer *this_00;
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  mapped_type *this_01;
  reference piVar5;
  size_type sVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  allocator<int> local_111;
  _Rb_tree_const_iterator<int> local_110;
  _Rb_tree_const_iterator<int> local_108;
  _Base_ptr local_100;
  undefined1 local_f8;
  int local_ec;
  iterator iStack_e8;
  int it;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  int c;
  undefined1 local_a0 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> que;
  set<int,_std::less<int>,_std::allocator<int>_> ret;
  int indx_local;
  NFA *this_local;
  
  ret._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = indx;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &que.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_a0);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0,
             (value_type *)((long)&ret._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &que.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,
             (value_type *)((long)&ret._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  while (bVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0);
    iVar1 = *pvVar3;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0);
    pvVar4 = std::vector<Status,_std::allocator<Status>_>::operator[]
                       (&this->StatusStore,(long)iVar1);
    __begin2._M_current._7_1_ = 0x2d;
    this_01 = std::
              map<char,_std::vector<int,_std::allocator<int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&pvVar4->Next,(key_type *)((long)&__begin2._M_current + 7));
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
    iStack_e8 = std::vector<int,_std::allocator<int>_>::end(this_01);
    while (bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                             (&__end2,&stack0xffffffffffffff18), ((bVar2 ^ 0xffU) & 1) != 0) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_ec = *piVar5;
      sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &que.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node,&local_ec);
      if (sVar6 == 0) {
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0,&local_ec);
        pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           &que.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node,&local_ec);
        local_100 = (_Base_ptr)pVar7.first._M_node;
        local_f8 = pVar7.second;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  this_00 = &que.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node;
  local_108._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  local_110._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  std::allocator<int>::allocator(&local_111);
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,local_108,local_110,
             &local_111);
  std::allocator<int>::~allocator(&local_111);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &que.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  return __return_storage_ptr__;
}

Assistant:

vector<int> getClosure(int indx){
        set<int>ret;
        queue<int>que;
        que.push(indx);
        ret.insert(indx);
        while (!que.empty()){
            int c = que.front();
            que.pop();
            for(auto it:(StatusStore[c].Next[EPSILON])){
                if(!ret.count(it)){
                    que.push(it);
                    ret.insert(it);
                }
            }
        }
        return vector<int>(ret.begin(),ret.end());
    }